

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O2

bool __thiscall ZAP::Archive::openMemory(Archive *this,char *data,size_t size)

{
  bool bVar1;
  istringstream *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this_00 = (istringstream *)operator_new(0x180);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,data,data + size);
  std::__cxx11::istringstream::istringstream(this_00,(string *)local_40,_S_in|_S_bin);
  this->stream = (istream *)this_00;
  std::__cxx11::string::~string((string *)local_40);
  bVar1 = loadStream(this);
  return bVar1;
}

Assistant:

bool Archive::openMemory(const char *data, std::size_t size)
	{
		stream = new std::istringstream(std::string(data, size), std::ios::in | std::ios::binary);
		return loadStream();
	}